

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O2

MMDB_entry_data_list_s * test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  MMDB_entry_data_s entry_data;
  char *got;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char expect [19];
  undefined5 uStack_25;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x139,(pMVar1->entry_data).type,"==",2,"\'utf8_string\' key\'s value is a string",0
               );
  uVar2 = *(undefined8 *)&pMVar1->entry_data;
  uVar3 = *(undefined8 *)&(pMVar1->entry_data).field_0x8;
  pcVar4 = (pMVar1->entry_data).field_1.utf8_string;
  entry_data.field_1._8_1_ = expect[0];
  entry_data.field_1._9_1_ = expect[1];
  entry_data.field_1._10_1_ = expect[2];
  entry_data.field_1._11_1_ = expect[3];
  entry_data._0_24_ = *(undefined1 (*) [24])((long)&(pMVar1->entry_data).field_1 + 8);
  entry_data.field_1._12_1_ = expect[4];
  entry_data.field_1._13_1_ = expect[5];
  entry_data.field_1._14_1_ = expect[6];
  entry_data.field_1._15_1_ = expect[7];
  entry_data.offset._0_1_ = expect[8];
  entry_data.offset._1_1_ = expect[9];
  entry_data.offset._2_1_ = expect[10];
  entry_data.offset._3_1_ = expect[0xb];
  entry_data.offset_to_next._0_1_ = expect[0xc];
  entry_data.offset_to_next._1_1_ = expect[0xd];
  entry_data.offset_to_next._2_1_ = expect[0xe];
  entry_data.offset_to_next._3_1_ = expect[0xf];
  entry_data.data_size._0_1_ = expect[0x10];
  entry_data.data_size._1_1_ = expect[0x11];
  entry_data.data_size._2_1_ = expect[0x12];
  entry_data._43_5_ = uStack_25;
  got = dup_entry_string_or_bail(entry_data);
  builtin_strncpy(expect,"unicode! ☯ - ♫",0x13);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
            ,0x150,got,expect,"got expected value for utf8_string key",0,uVar2,uVar3,pcVar4);
  free(got);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_utf8_string_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_UTF8_STRING,
           "'utf8_string' key's value is a string");
    char *utf8_string = dup_entry_string_or_bail(value->entry_data);
    // This is hex for "unicode! ☯ - ♫" as bytes
    char expect[19] = {0x75,
                       0x6e,
                       0x69,
                       0x63,
                       0x6f,
                       0x64,
                       0x65,
                       0x21,
                       0x20,
                       (char)0xe2,
                       (char)0x98,
                       (char)0xaf,
                       0x20,
                       0x2d,
                       0x20,
                       (char)0xe2,
                       (char)0x99,
                       (char)0xab,
                       0x00};

    is(utf8_string, expect, "got expected value for utf8_string key");

    free(utf8_string);

    return entry_data_list;
}